

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentBeforeValue(BuiltStyledStreamWriter *this,Value *root)

{
  pointer pcVar1;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var2;
  long *plVar3;
  char local_41;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (((this->cs_ != None) &&
      (_Var2._M_head_impl =
            (root->comments_).ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl,
      _Var2._M_head_impl !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0)) && (*(size_type *)((long)(_Var2._M_head_impl)->_M_elems + 8) != 0)) {
    if ((this->field_0xd8 & 2) == 0) {
      writeIndent(this);
      _Var2._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var2._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        this->field_0xd8 = this->field_0xd8 & 0xfd;
        return;
      }
    }
    pcVar1 = (_Var2._M_head_impl)->_M_elems[0]._M_dataplus._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,
               pcVar1 + (_Var2._M_head_impl)->_M_elems[0]._M_string_length);
    if (local_38 != 0) {
      plVar3 = local_40;
      do {
        local_41 = (char)*plVar3;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_StreamWriter).sout_,&local_41,1);
        if ((((char)*plVar3 == '\n') &&
            ((char *)((long)plVar3 + 1) != (char *)((long)local_40 + local_38))) &&
           (*(char *)((long)plVar3 + 1) == '/')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->super_StreamWriter).sout_,(this->indentString_)._M_dataplus._M_p,
                     (this->indentString_)._M_string_length);
        }
        plVar3 = (long *)((long)plVar3 + 1);
      } while (plVar3 != (long *)((long)local_40 + local_38));
    }
    this->field_0xd8 = this->field_0xd8 & 0xfd;
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentBeforeValue(Value const& root) {
  if (cs_ == CommentStyle::None)
    return;
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_)
    writeIndent();
  const String& comment = root.getComment(commentBefore);
  String::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *sout_ << *iter;
    if (*iter == '\n' && ((iter + 1) != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would write extra newline
      *sout_ << indentString_;
    ++iter;
  }
  indented_ = false;
}